

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O1

void __thiscall RedBlackTree::insertElement(RedBlackTree *this,int value)

{
  Node *pNVar1;
  Node *node;
  Node *local_18;
  
  local_18 = (Node *)operator_new(0x20);
  local_18->value = value;
  *(undefined8 *)&local_18->color = 0;
  *(undefined8 *)((long)&local_18->left + 4) = 0;
  local_18->right = (Node *)0x0;
  local_18->parent = (Node *)0x0;
  pNVar1 = insert(this,&this->root,&local_18);
  this->root = pNVar1;
  fixInsert(this,&local_18);
  return;
}

Assistant:

void RedBlackTree::insertElement(int value) {
    auto *node = new Node(value);
    root = insert(root, node);
    fixInsert(node);
}